

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintExdc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  char *format;
  double local_30;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar3 = Extra_UtilGetopt(argc,argv,"sdh");
    } while (iVar3 == 0x73);
    if (iVar3 == -1) break;
    if (iVar3 != 100) {
      Abc_Print(-2,"usage: print_exdc [-dh]\n");
      Abc_Print(-2,"\t        prints the EXDC network statistics\n");
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d    : toggles printing don\'t-care percentage [default = %s]\n",pcVar6);
      pcVar6 = "\t-h    : print the command usage\n";
      iVar3 = -2;
LAB_001f9908:
      Abc_Print(iVar3,pcVar6);
      return 1;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (pAVar4 == (Abc_Ntk_t *)0x0) {
    pcVar6 = "Empty network.\n";
  }
  else {
    pAVar5 = pAVar4->pExdc;
    if (pAVar5 != (Abc_Ntk_t *)0x0) {
      if (bVar2) {
        if (pAVar5->ntkType == ABC_NTK_STRASH) {
          if (pAVar5->vPos->nSize < 1) {
LAB_001f9a4a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar1 = (long *)*pAVar5->vPos->pArray;
          local_30 = Abc_NtkSpacePercentage
                               ((Abc_Obj_t *)
                                ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                          (long)*(int *)plVar1[4] * 8)));
        }
        else {
          pAVar5 = Abc_NtkStrash(pAVar5,0,0,0);
          if (pAVar5->vPos->nSize < 1) goto LAB_001f9a4a;
          plVar1 = (long *)*pAVar5->vPos->pArray;
          local_30 = Abc_NtkSpacePercentage
                               ((Abc_Obj_t *)
                                ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                          (long)*(int *)plVar1[4] * 8)));
          Abc_NtkDelete(pAVar5);
        }
        Abc_Print(1,"EXDC network statistics: ");
        Abc_Print(1,"(");
        pcVar6 = "%.6f";
        if (99.999995 <= local_30) {
          pcVar6 = "%f";
        }
        if (local_30 <= 5e-06) {
          pcVar6 = "%f";
        }
        format = "%.2f";
        if (99.95 <= local_30) {
          format = pcVar6;
        }
        if (local_30 <= 0.05) {
          format = pcVar6;
        }
        Abc_Print(1,format);
        pcVar6 = " %% don\'t-cares)\n";
      }
      else {
        pcVar6 = "EXDC network statistics: \n";
      }
      Abc_Print(1,pcVar6);
      Abc_NtkPrintStats(pAVar4->pExdc,0,0,0,0,0,0,0,0,0);
      return 0;
    }
    pcVar6 = "Network has no EXDC.\n";
  }
  iVar3 = -1;
  goto LAB_001f9908;
}

Assistant:

int Abc_CommandPrintExdc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp;
    double Percentage;
    int fShort;
    int c;
    int fPrintDc;
    extern double Abc_NtkSpacePercentage( Abc_Obj_t * pNode );
    pNtk = Abc_FrameReadNtk(pAbc);

    // set the defaults
    fShort  = 1;
    fPrintDc = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'd':
            fPrintDc ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pNtk->pExdc == NULL )
    {
        Abc_Print( -1, "Network has no EXDC.\n" );
        return 1;
    }

    if ( fPrintDc )
    {
        if ( !Abc_NtkIsStrash(pNtk->pExdc) )
        {
            pNtkTemp = Abc_NtkStrash(pNtk->pExdc, 0, 0, 0);
            Percentage = Abc_NtkSpacePercentage( Abc_ObjChild0( Abc_NtkPo(pNtkTemp, 0) ) );
            Abc_NtkDelete( pNtkTemp );
        }
        else
            Percentage = Abc_NtkSpacePercentage( Abc_ObjChild0( Abc_NtkPo(pNtk->pExdc, 0) ) );

        Abc_Print( 1, "EXDC network statistics: " );
        Abc_Print( 1, "(" );
        if ( Percentage > 0.05 && Percentage < 99.95 )
            Abc_Print( 1, "%.2f", Percentage );
        else if ( Percentage > 0.000005 && Percentage < 99.999995 )
            Abc_Print( 1, "%.6f", Percentage );
        else
            Abc_Print( 1, "%f", Percentage );
        Abc_Print( 1, " %% don't-cares)\n" );
    }
    else
        Abc_Print( 1, "EXDC network statistics: \n" );
    Abc_NtkPrintStats( pNtk->pExdc, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: print_exdc [-dh]\n" );
    Abc_Print( -2, "\t        prints the EXDC network statistics\n" );
    Abc_Print( -2, "\t-d    : toggles printing don't-care percentage [default = %s]\n", fPrintDc? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}